

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontEffectOutline.cpp
# Opt level: O0

bool __thiscall
Rml::FontEffectOutline::GetGlyphMetrics
          (FontEffectOutline *this,Vector2i *origin,Vector2i *dimensions,FontGlyph *param_3)

{
  bool bVar1;
  FontGlyph *param_3_local;
  Vector2i *dimensions_local;
  Vector2i *origin_local;
  FontEffectOutline *this_local;
  
  bVar1 = 0 < dimensions->x * dimensions->y;
  if (bVar1) {
    origin->x = origin->x - this->width;
    origin->y = origin->y - this->width;
    dimensions->x = this->width * 2 + dimensions->x;
    dimensions->y = this->width * 2 + dimensions->y;
  }
  return bVar1;
}

Assistant:

bool FontEffectOutline::GetGlyphMetrics(Vector2i& origin, Vector2i& dimensions, const FontGlyph& /*glyph*/) const
{
	if (dimensions.x * dimensions.y > 0)
	{
		origin.x -= width;
		origin.y -= width;

		dimensions.x += 2 * width;
		dimensions.y += 2 * width;

		return true;
	}

	return false;
}